

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_preprocess.c
# Opt level: O3

void amd_l_preprocess(longlong n,longlong *Ap,longlong *Ai,longlong *Rp,longlong *Ri,longlong *W,
                     longlong *Flag)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  if (0 < n) {
    lVar4 = 0;
    do {
      W[lVar4] = 0;
      Flag[lVar4] = -1;
      lVar4 = lVar4 + 1;
    } while (n != lVar4);
    if (0 < n) {
      lVar4 = 0;
      do {
        lVar5 = Ap[lVar4];
        lVar1 = Ap[lVar4 + 1];
        if (lVar5 < lVar1) {
          do {
            lVar2 = Ai[lVar5];
            if (Flag[lVar2] != lVar4) {
              W[lVar2] = W[lVar2] + 1;
              Flag[lVar2] = lVar4;
            }
            lVar5 = lVar5 + 1;
          } while (lVar1 != lVar5);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != n);
      *Rp = 0;
      if (n < 1) {
        return;
      }
      lVar4 = 0;
      lVar5 = 0;
      do {
        lVar4 = lVar4 + W[lVar5];
        Rp[lVar5 + 1] = lVar4;
        lVar5 = lVar5 + 1;
      } while (n != lVar5);
      if (n < 1) {
        return;
      }
      lVar4 = 0;
      do {
        W[lVar4] = Rp[lVar4];
        Flag[lVar4] = -1;
        lVar4 = lVar4 + 1;
      } while (n != lVar4);
      if (n < 1) {
        return;
      }
      lVar4 = 0;
      do {
        lVar5 = Ap[lVar4];
        lVar1 = Ap[lVar4 + 1];
        if (lVar5 < lVar1) {
          do {
            lVar2 = Ai[lVar5];
            if (Flag[lVar2] != lVar4) {
              lVar3 = W[lVar2];
              W[lVar2] = lVar3 + 1;
              Ri[lVar3] = lVar4;
              Flag[lVar2] = lVar4;
            }
            lVar5 = lVar5 + 1;
          } while (lVar1 != lVar5);
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != n);
      return;
    }
  }
  *Rp = 0;
  return;
}

Assistant:

GLOBAL void AMD_preprocess
(
    Int n,		/* input matrix: A is n-by-n */
    const Int Ap [ ],	/* size n+1 */
    const Int Ai [ ],	/* size nz = Ap [n] */

    /* output matrix R: */
    Int Rp [ ],		/* size n+1 */
    Int Ri [ ],		/* size nz (or less, if duplicates present) */

    Int W [ ],		/* workspace of size n */
    Int Flag [ ]	/* workspace of size n */
)
{

    /* --------------------------------------------------------------------- */
    /* local variables */
    /* --------------------------------------------------------------------- */

    Int i, j, p, p2 ;

    ASSERT (AMD_valid (n, n, Ap, Ai) != AMD_INVALID) ;

    /* --------------------------------------------------------------------- */
    /* count the entries in each row of A (excluding duplicates) */
    /* --------------------------------------------------------------------- */

    for (i = 0 ; i < n ; i++)
    {
	W [i] = 0 ;		/* # of nonzeros in row i (excl duplicates) */
	Flag [i] = EMPTY ;	/* Flag [i] = j if i appears in column j */
    }
    for (j = 0 ; j < n ; j++)
    {
	p2 = Ap [j+1] ;
	for (p = Ap [j] ; p < p2 ; p++)
	{
	    i = Ai [p] ;
	    if (Flag [i] != j)
	    {
		/* row index i has not yet appeared in column j */
		W [i]++ ;	    /* one more entry in row i */
		Flag [i] = j ;	    /* flag row index i as appearing in col j*/
	    }
	}
    }

    /* --------------------------------------------------------------------- */
    /* compute the row pointers for R */
    /* --------------------------------------------------------------------- */

    Rp [0] = 0 ;
    for (i = 0 ; i < n ; i++)
    {
	Rp [i+1] = Rp [i] + W [i] ;
    }
    for (i = 0 ; i < n ; i++)
    {
	W [i] = Rp [i] ;
	Flag [i] = EMPTY ;
    }

    /* --------------------------------------------------------------------- */
    /* construct the row form matrix R */
    /* --------------------------------------------------------------------- */

    /* R = row form of pattern of A */
    for (j = 0 ; j < n ; j++)
    {
	p2 = Ap [j+1] ;
	for (p = Ap [j] ; p < p2 ; p++)
	{
	    i = Ai [p] ;
	    if (Flag [i] != j)
	    {
		/* row index i has not yet appeared in column j */
		Ri [W [i]++] = j ;  /* put col j in row i */
		Flag [i] = j ;	    /* flag row index i as appearing in col j*/
	    }
	}
    }

#ifndef NDEBUG
    ASSERT (AMD_valid (n, n, Rp, Ri) == AMD_OK) ;
    for (j = 0 ; j < n ; j++)
    {
	ASSERT (W [j] == Rp [j+1]) ;
    }
#endif
}